

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall
kj::anon_unknown_35::InMemoryDirectory::SymlinkNode::parse
          (Path *__return_storage_ptr__,SymlinkNode *this)

{
  size_t sVar1;
  Path *extraout_RAX;
  size_t in_RCX;
  Path *this_00;
  StringPtr path;
  anon_class_8_1_8991fb9c _kjContextFunc1364;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:1364:7)>
  _kjContext1364;
  SymlinkNode *local_78;
  Context local_70;
  undefined1 *local_28;
  
  local_78 = this;
  kj::_::Debug::Context::Context(&local_70);
  local_70.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&PTR__Context_0062ec70;
  sVar1 = (this->content).content.size_;
  if (sVar1 == 0) {
    this_00 = (Path *)0x4f5114;
  }
  else {
    this_00 = (Path *)(this->content).content.ptr;
  }
  path.content.ptr = (char *)(sVar1 + (sVar1 == 0));
  path.content.size_ = in_RCX;
  local_28 = (undefined1 *)&local_78;
  Path::parse(__return_storage_ptr__,this_00,path);
  kj::_::Debug::Context::~Context(&local_70);
  return extraout_RAX;
}

Assistant:

Path parse() const {
      KJ_CONTEXT("parsing symlink", content);
      return Path::parse(content);
    }